

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_test.cpp
# Opt level: O3

deque<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
* __thiscall
diff_match_patch_test::diff_rebuildtexts_abi_cxx11_
          (deque<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           *__return_storage_ptr__,diff_match_patch_test *this,
          deque<Diff,_std::allocator<Diff>_> *diffs)

{
  _Elt_pointer pDVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  _Elt_pointer pbVar5;
  Diff *myDiff;
  _Elt_pointer pDVar6;
  _Elt_pointer pDVar7;
  _Map_pointer ppDVar8;
  
  (__return_storage_ptr__->
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  )._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (__return_storage_ptr__->
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  )._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (__return_storage_ptr__->
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  )._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (__return_storage_ptr__->
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  )._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (__return_storage_ptr__->
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  )._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (__return_storage_ptr__->
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  )._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (__return_storage_ptr__->
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  )._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (__return_storage_ptr__->
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  )._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (__return_storage_ptr__->
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  )._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (__return_storage_ptr__->
  super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  )._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::_M_initialize_map(&__return_storage_ptr__->
                       super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                      ,0);
  std::
  deque<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::emplace_back<>(__return_storage_ptr__);
  std::
  deque<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::emplace_back<>(__return_storage_ptr__);
  pDVar6 = (diffs->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
           _M_start._M_cur;
  pDVar1 = (diffs->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
           _M_finish._M_cur;
  if (pDVar6 != pDVar1) {
    pDVar7 = (diffs->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
             _M_start._M_last;
    ppDVar8 = (diffs->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data
              ._M_start._M_node;
    do {
      if (pDVar6->operation == Insert) {
LAB_0015683a:
        pbVar5 = (__return_storage_ptr__->
                 super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 )._M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar3 = (long)pbVar5 -
                (long)(__return_storage_ptr__->
                      super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                      )._M_impl.super__Deque_impl_data._M_start._M_first >> 5;
        uVar2 = lVar3 + 1;
        if (lVar3 < -1) {
          uVar4 = (long)uVar2 >> 4;
LAB_00156876:
          pbVar5 = (__return_storage_ptr__->
                   super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   )._M_impl.super__Deque_impl_data._M_start._M_node[uVar4] + uVar2 + uVar4 * -0x10;
        }
        else {
          if (0xf < uVar2) {
            uVar4 = uVar2 >> 4;
            goto LAB_00156876;
          }
          pbVar5 = pbVar5 + 1;
        }
        std::__cxx11::wstring::_M_append((wchar_t *)pbVar5,(ulong)(pDVar6->text)._M_dataplus._M_p);
      }
      else {
        pbVar5 = (__return_storage_ptr__->
                 super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 )._M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar3 = (long)pbVar5 -
                (long)(__return_storage_ptr__->
                      super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                      )._M_impl.super__Deque_impl_data._M_start._M_first;
        uVar2 = lVar3 >> 5;
        if ((long)uVar2 < 0) {
          uVar4 = lVar3 >> 9;
LAB_0015680f:
          pbVar5 = (__return_storage_ptr__->
                   super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   )._M_impl.super__Deque_impl_data._M_start._M_node[uVar4] + uVar2 + uVar4 * -0x10;
        }
        else if (0xf < uVar2) {
          uVar4 = uVar2 >> 4;
          goto LAB_0015680f;
        }
        std::__cxx11::wstring::_M_append((wchar_t *)pbVar5,(ulong)(pDVar6->text)._M_dataplus._M_p);
        if (pDVar6->operation != Delete) goto LAB_0015683a;
      }
      pDVar6 = pDVar6 + 1;
      if (pDVar6 == pDVar7) {
        pDVar6 = ppDVar8[1];
        ppDVar8 = ppDVar8 + 1;
        pDVar7 = pDVar6 + 0xc;
      }
    } while (pDVar6 != pDVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::deque<std::wstring> diff_match_patch_test::diff_rebuildtexts(std::deque<Diff> diffs) {
  std::deque<std::wstring> text;
  text.emplace_back();
  text.emplace_back();
  for (const Diff& myDiff : diffs) {
    if (myDiff.operation != Diff::Operation::Insert) {
      text[0] += myDiff.text;
    }
    if (myDiff.operation != Diff::Operation::Delete) {
      text[1] += myDiff.text;
    }
  }
  return text;
}